

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picobench.hpp
# Opt level: O3

benchmarks_vector * __thiscall picobench::registry::benchmarks_for_current_suite(registry *this)

{
  pointer prVar1;
  char *__s1;
  int iVar2;
  rsuite *s;
  pointer prVar3;
  rsuite local_40;
  
  local_40.name = this->_current_suite_name;
  prVar3 = (this->_suites).super__Vector_base<picobench::rsuite,_std::allocator<picobench::rsuite>_>
           ._M_impl.super__Vector_impl_data._M_start;
  prVar1 = (this->_suites).super__Vector_base<picobench::rsuite,_std::allocator<picobench::rsuite>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  while( true ) {
    if (prVar3 == prVar1) {
      local_40.benchmarks.
      super__Vector_base<std::unique_ptr<picobench::benchmark_impl,_std::default_delete<picobench::benchmark_impl>_>,_std::allocator<std::unique_ptr<picobench::benchmark_impl,_std::default_delete<picobench::benchmark_impl>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_40.benchmarks.
      super__Vector_base<std::unique_ptr<picobench::benchmark_impl,_std::default_delete<picobench::benchmark_impl>_>,_std::allocator<std::unique_ptr<picobench::benchmark_impl,_std::default_delete<picobench::benchmark_impl>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_40.benchmarks.
      super__Vector_base<std::unique_ptr<picobench::benchmark_impl,_std::default_delete<picobench::benchmark_impl>_>,_std::allocator<std::unique_ptr<picobench::benchmark_impl,_std::default_delete<picobench::benchmark_impl>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::vector<picobench::rsuite,_std::allocator<picobench::rsuite>_>::
      emplace_back<picobench::rsuite>(&this->_suites,&local_40);
      std::
      vector<std::unique_ptr<picobench::benchmark_impl,_std::default_delete<picobench::benchmark_impl>_>,_std::allocator<std::unique_ptr<picobench::benchmark_impl,_std::default_delete<picobench::benchmark_impl>_>_>_>
      ::~vector(&local_40.benchmarks);
      return &(this->_suites).
              super__Vector_base<picobench::rsuite,_std::allocator<picobench::rsuite>_>._M_impl.
              super__Vector_impl_data._M_finish[-1].benchmarks;
    }
    __s1 = prVar3->name;
    if ((__s1 == local_40.name) ||
       ((__s1 != (char *)0x0 && local_40.name != (char *)0x0 &&
        (iVar2 = strcmp(__s1,local_40.name), iVar2 == 0)))) break;
    prVar3 = prVar3 + 1;
  }
  return &prVar3->benchmarks;
}

Assistant:

benchmarks_vector& benchmarks_for_current_suite()
    {
        for (auto& s : _suites)
        {
            if (s.name == _current_suite_name)
                return s.benchmarks;

            if (s.name && _current_suite_name && strcmp(s.name, _current_suite_name) == 0)
                return s.benchmarks;
        }
        _suites.push_back({ _current_suite_name, {} });
        return _suites.back().benchmarks;
    }